

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_1>::calcEdgeLogLikelihoodsByAutoPartitionAsync
          (BeagleCPUImpl<double,_1,_1> *this,int *parentBufferIndices,int *childBufferIndices,
          int *probabilityIndices,int *categoryWeightsIndices,int *stateFrequenciesIndices,
          int *cumulativeScaleIndices,int *partitionIndices,double *outSumLogLikelihoodByPartition)

{
  BeagleCPUImpl<double,_1,_1> **in_RSI;
  offset_in_BeagleCPUImpl<double,_1,_1>_to_subr *in_RDI;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_00000010;
  long in_stack_00000018;
  int i_1;
  unique_lock<std::mutex> l;
  threadData *td;
  packaged_task<void_()> threadTask;
  int i;
  mutex_type *__m;
  unique_lock<std::mutex> *this_00;
  shared_future<void> *__sf;
  packaged_task<void_()> *this_01;
  _Bind<void_(beagle::cpu::BeagleCPUImpl<double,_1,_1>::*(beagle::cpu::BeagleCPUImpl<double,_1,_1>_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*))(const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*)>
  *in_stack_fffffffffffffea8;
  packaged_task<void_()> *in_stack_fffffffffffffeb0;
  int **in_stack_fffffffffffffeb8;
  BeagleCPUImpl<double,_1,_1> **in_stack_fffffffffffffec8;
  int local_124;
  int **in_stack_ffffffffffffff00;
  int **in_stack_ffffffffffffff08;
  int **in_stack_ffffffffffffff10;
  element_type *in_stack_ffffffffffffff18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff20;
  packaged_task<void_()> local_c8;
  undefined8 local_b8;
  undefined8 local_b0;
  int *local_a8 [12];
  BeagleCPUImpl<double,_1,_1> *local_48 [2];
  int local_34;
  undefined1 local_30 [48];
  
  for (local_34 = 0; local_34 < (int)in_RDI[0x27]; local_34 = local_34 + 1) {
    local_b0 = 0;
    local_b8 = 0x279;
    local_c8._M_state.
    super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)
             ((long)&(in_stack_00000010._M_pi)->_vptr__Sp_counted_base + (long)local_34 * 4);
    this_01 = &local_c8;
    __sf = (shared_future<void> *)&stack0x00000008;
    this_00 = (unique_lock<std::mutex> *)local_30;
    __m = (mutex_type *)(local_30 + 8);
    std::
    bind<void(beagle::cpu::BeagleCPUImpl<double,1,1>::*)(int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int,double*),beagle::cpu::BeagleCPUImpl<double,1,1>*,int_const*&,int_const*&,int_const*&,int_const*&,int_const*&,int_const*&,int_const*,int,double*>
              (in_RDI,in_stack_fffffffffffffec8,local_a8,in_stack_fffffffffffffeb8,
               (int **)in_stack_fffffffffffffeb0,in_stack_ffffffffffffff00,in_stack_ffffffffffffff08
               ,in_stack_ffffffffffffff10,(int **)in_stack_ffffffffffffff18,
               (int *)in_stack_ffffffffffffff20._M_pi,
               (double **)(in_stack_00000018 + (long)local_34 * 8));
    in_stack_fffffffffffffec8 = local_48;
    std::packaged_task<void()>::
    packaged_task<std::_Bind<void(beagle::cpu::BeagleCPUImpl<double,1,1>::*(beagle::cpu::BeagleCPUImpl<double,1,1>*,int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int,double*))(int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int,double*)>,void>
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    std::packaged_task<void_()>::get_future((packaged_task<void_()> *)in_stack_fffffffffffffea8);
    in_stack_fffffffffffffeb0 = (packaged_task<void_()> *)&stack0xffffffffffffff18;
    in_stack_fffffffffffffeb8 = (int **)&stack0xffffffffffffff08;
    std::shared_future<void>::shared_future((shared_future<void> *)this_00,(future<void> *)__m);
    std::shared_future<void>::operator=((shared_future<void> *)this_01,__sf);
    std::shared_future<void>::~shared_future((shared_future<void> *)0x1a67f4);
    std::future<void>::~future((future<void> *)0x1a67fe);
    std::unique_lock<std::mutex>::unique_lock(this_00,__m);
    in_RSI = local_48;
    std::
    queue<std::packaged_task<void_()>,_std::deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>_>
    ::push((queue<std::packaged_task<void_()>,_std::deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>_>
            *)this_00,(value_type *)__m);
    std::unique_lock<std::mutex>::unlock(this_00);
    std::condition_variable::notify_one();
    std::unique_lock<std::mutex>::~unique_lock(this_00);
    std::packaged_task<void_()>::~packaged_task(this_01);
  }
  for (local_124 = 0; local_124 < (int)in_RDI[0x27]; local_124 = local_124 + 1) {
    std::__basic_future<void>::wait
              ((__basic_future<void> *)(in_RDI[0x2e] + (long)local_124 * 0x10),in_RSI);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
    void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsByAutoPartitionAsync(
                                                        const int* parentBufferIndices,
                                                        const int* childBufferIndices,
                                                        const int* probabilityIndices,
                                                        const int* categoryWeightsIndices,
                                                        const int* stateFrequenciesIndices,
                                                        const int* cumulativeScaleIndices,
                                                        const int* partitionIndices,
                                                        double* outSumLogLikelihoodByPartition) {

    for (int i=0; i<kNumThreads; i++) {

        std::packaged_task<void()> threadTask(
            std::bind(&BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsByPartition, this,
                      parentBufferIndices,
                      childBufferIndices,
                      probabilityIndices,
                      categoryWeightsIndices,
                      stateFrequenciesIndices,
                      cumulativeScaleIndices,
                      &partitionIndices[i],
                      1,
                      &outSumLogLikelihoodByPartition[i]));

        gFutures[i] = threadTask.get_future();
        threadData* td = &gThreads[i];

        std::unique_lock<std::mutex> l(td->m);
        td->jobs.push(std::move(threadTask));
        l.unlock();

        gThreads[i].cv.notify_one();
    }

    for (int i=0; i<kNumThreads; i++) {
        gFutures[i].wait();
    }

}